

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnReturnCallIndirectExpr
          (BinaryReaderIR *this,Index sig_index,Index table_index)

{
  char *pcVar1;
  Offset OVar2;
  Module *this_00;
  Result RVar3;
  tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_> tVar4;
  FuncType *pFVar5;
  Location loc_1;
  Location loc;
  __uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_> local_f0;
  Location local_e8;
  Var local_c8;
  Var local_78;
  
  if (this->current_func_ != (Func *)0x0) {
    (this->current_func_->features_used).tailcall = true;
  }
  tVar4.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>)operator_new(0x108);
  *(long *)((long)tVar4.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)tVar4.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x10) = 0;
  *(long *)((long)tVar4.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x18) = 0;
  *(long *)((long)tVar4.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x20) = 0;
  *(undefined8 *)
   ((long)tVar4.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x24) = 0;
  *(undefined8 *)
   ((long)tVar4.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x2c) = 0;
  *(undefined4 *)
   ((long)tVar4.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x38) = 0x29;
  *(undefined ***)
   tVar4.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
   super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = &PTR__ReturnCallIndirectExpr_00182460;
  *(undefined1 *)
   ((long)tVar4.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x40) = 0;
  Var::Var((Var *)((long)tVar4.
                         super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                         super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x48));
  *(long *)((long)tVar4.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0xb0) = 0;
  *(long *)((long)tVar4.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0xb8) = 0;
  *(long *)((long)tVar4.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0xa0) = 0;
  *(long *)((long)tVar4.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0xa8) = 0;
  *(long *)((long)tVar4.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x90) = 0;
  *(long *)((long)tVar4.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x98) = 0;
  Var::Var((Var *)((long)tVar4.
                         super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                         super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0xc0));
  local_c8.loc.field_1.field_0.line = 0;
  local_c8.loc.field_1.field_0.first_column = 0;
  local_c8.loc.field_1.field_0.last_column = 0;
  local_c8.loc.filename._M_len = 0;
  local_c8.loc.filename._M_str._0_4_ = 0;
  local_c8.loc.filename._M_str._4_4_ = 0;
  pcVar1 = this->filename_;
  local_c8.loc.filename._M_len = strlen(pcVar1);
  local_c8.loc.filename._M_str._0_4_ = SUB84(pcVar1,0);
  local_c8.loc.filename._M_str._4_4_ = (undefined4)((ulong)pcVar1 >> 0x20);
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_c8.loc.field_1.field_0.line = (int)OVar2;
  local_c8.loc.field_1.field_0.first_column = (int)(OVar2 >> 0x20);
  Var::Var(&local_78,sig_index,&local_c8.loc);
  SetFuncDeclaration(this,(FuncDeclaration *)
                          ((long)tVar4.
                                 super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>
                                 .super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x40),
                     &local_78);
  Var::~Var(&local_78);
  local_e8.field_1.field_0.line = 0;
  local_e8.field_1.field_0.first_column = 0;
  local_e8.field_1.field_0.last_column = 0;
  local_e8.filename._M_len = 0;
  local_e8.filename._M_str._0_4_ = 0;
  local_e8.filename._M_str._4_4_ = 0;
  pcVar1 = this->filename_;
  local_e8.filename._M_len = strlen(pcVar1);
  local_e8.filename._M_str._0_4_ = SUB84(pcVar1,0);
  local_e8.filename._M_str._4_4_ = (undefined4)((ulong)pcVar1 >> 0x20);
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_e8.field_1.field_0.line = (int)OVar2;
  local_e8.field_1.field_0.first_column = (int)(OVar2 >> 0x20);
  Var::Var(&local_c8,table_index,&local_e8);
  Var::operator=((Var *)((long)tVar4.
                               super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>
                               .super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0xc0),
                 &local_c8);
  Var::~Var(&local_c8);
  this_00 = this->module_;
  local_e8.field_1.field_0.line = 0;
  local_e8.field_1.field_0.first_column = 0;
  local_e8.field_1.field_0.last_column = 0;
  local_e8.filename._M_len = 0;
  local_e8.filename._M_str._0_4_ = 0;
  local_e8.filename._M_str._4_4_ = 0;
  pcVar1 = this->filename_;
  local_e8.filename._M_len = strlen(pcVar1);
  local_e8.filename._M_str._0_4_ = SUB84(pcVar1,0);
  local_e8.filename._M_str._4_4_ = (undefined4)((ulong)pcVar1 >> 0x20);
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_e8.field_1.field_0.line = (int)OVar2;
  local_e8.field_1.field_0.first_column = (int)(OVar2 >> 0x20);
  Var::Var(&local_c8,sig_index,&local_e8);
  pFVar5 = Module::GetFuncType(this_00,&local_c8);
  Var::~Var(&local_c8);
  if (pFVar5 != (FuncType *)0x0) {
    (pFVar5->features_used).tailcall = true;
  }
  local_f0._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
       (tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
       (tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
       tVar4.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
       super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
  RVar3 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_f0);
  if ((_Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
      local_f0._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
      super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl != (Expr *)0x0) {
    (**(code **)(*(long *)local_f0._M_t.
                          super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 8))();
  }
  return (Result)RVar3.enum_;
}

Assistant:

Result BinaryReaderIR::OnReturnCallIndirectExpr(Index sig_index,
                                                Index table_index) {
  if (current_func_) {
    // syntactically, a return_call_indirect expr can occur in an init
    // expression (outside a function)
    current_func_->features_used.tailcall = true;
  }
  auto expr = std::make_unique<ReturnCallIndirectExpr>();
  SetFuncDeclaration(&expr->decl, Var(sig_index, GetLocation()));
  expr->table = Var(table_index, GetLocation());
  FuncType* type = module_->GetFuncType(Var(sig_index, GetLocation()));
  if (type) {
    type->features_used.tailcall = true;
  }
  return AppendExpr(std::move(expr));
}